

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O1

int lws_buflist_fragment_use
              (lws_buflist **head,uint8_t *buf,size_t len,char *frag_first,char *frag_fin)

{
  lws_buflist *plVar1;
  ulong __n;
  
  plVar1 = *head;
  if (plVar1 == (lws_buflist *)0x0) {
    __n = 0;
  }
  else {
    __n = plVar1->len - plVar1->pos;
    if (len <= __n) {
      __n = len;
    }
    if (frag_first != (char *)0x0) {
      *frag_first = plVar1->pos == 0;
    }
    if (frag_fin != (char *)0x0) {
      *frag_fin = (*head)->pos + __n == (*head)->len;
    }
    memcpy(buf,(void *)((long)&(*head)[1].pos + (*head)->pos),__n);
    lws_buflist_use_segment(head,__n);
  }
  return (int)__n;
}

Assistant:

int
lws_buflist_fragment_use(struct lws_buflist **head, uint8_t *buf,
			 size_t len, char *frag_first, char *frag_fin)
{
	uint8_t *obuf = buf;
	size_t s;

	if (!*head)
		return 0;

	s = (*head)->len - (*head)->pos;
	if (s > len)
		s = len;

	if (frag_first)
		*frag_first = !(*head)->pos;

	if (frag_fin)
		*frag_fin = (*head)->pos + s == (*head)->len;

	memcpy(buf, ((uint8_t *)((*head) + 1)) + LWS_PRE + (*head)->pos, s);
	len -= s;
	buf += s;
	lws_buflist_use_segment(head, s);

	return lws_ptr_diff(buf, obuf);
}